

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O0

void __thiscall
slang::analysis::AnalysisScopeVisitor::checkUnused
          (AnalysisScopeVisitor *this,Symbol *symbol,DiagCode code)

{
  bitmask<slang::analysis::AnalysisFlags> flags;
  bool bVar1;
  pair<bool,_bool> pVar2;
  AnalysisScopeVisitor *this_00;
  type_conflict1 *ptVar3;
  Symbol *in_RSI;
  AnalysisManager *in_RDI;
  type_conflict1 *_;
  type_conflict1 *used;
  SyntaxNode *syntax;
  undefined6 in_stack_ffffffffffffffd0;
  DiagCode in_stack_ffffffffffffffe4;
  
  flags.m_bits = (in_RDI->options).numThreads;
  bitmask<slang::analysis::AnalysisFlags>::bitmask
            ((bitmask<slang::analysis::AnalysisFlags> *)&stack0xffffffffffffffe4,CheckUnused);
  bVar1 = AnalysisManager::hasFlag(in_RDI,flags);
  if (((bVar1) &&
      (this_00 = (AnalysisScopeVisitor *)ast::Symbol::getSyntax(in_RSI),
      this_00 != (AnalysisScopeVisitor *)0x0)) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RSI->name), !bVar1))
  {
    pVar2 = isReferenced((AnalysisScopeVisitor *)in_RDI,(SyntaxNode *)0x818324);
    ptVar3 = std::get<0ul,bool,bool>((pair<bool,_bool> *)0x818333);
    std::get<1ul,bool,bool>((pair<bool,_bool> *)0x818342);
    if ((*ptVar3 & 1U) == 0) {
      addDiag(this_00,(Symbol *)CONCAT26(pVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffe4)
      ;
    }
  }
  return;
}

Assistant:

void checkUnused(const Symbol& symbol, DiagCode code) {
        if (!manager.hasFlag(AnalysisFlags::CheckUnused))
            return;

        auto syntax = symbol.getSyntax();
        if (!syntax || symbol.name.empty())
            return;

        auto [used, _] = isReferenced(*syntax);
        if (!used)
            addDiag(symbol, code);
    }